

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaTests.cc
# Opt level: O0

void avro::schema::testBasic_fail(char *schema)

{
  bool bVar1;
  basic_wrap_stringstream<char> *file;
  Exception *ex;
  char **in_stack_fffffffffffffcc8;
  undefined1 pv_;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffcd0;
  std_string *in_stack_fffffffffffffcd8;
  undefined7 in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffce7;
  basic_wrap_stringstream<char> *in_stack_fffffffffffffcf0;
  const_string *msg;
  basic_wrap_stringstream<char> *this;
  unit_test_log_t *in_stack_fffffffffffffd20;
  basic_cstring<const_char> local_270;
  lazy_ostream local_260 [2];
  assertion_result local_240;
  basic_cstring<const_char> local_218;
  char local_208 [32];
  basic_cstring<const_char> local_1e8;
  basic_cstring<const_char> local_20 [2];
  
  msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
             ,0x6e);
  this = (basic_wrap_stringstream<char> *)&stack0xfffffffffffffe38;
  memset(this,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffffcd0);
  file = boost::basic_wrap_stringstream<char>::ref(this);
  boost::operator<<(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffffcf0);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)
             CONCAT17(in_stack_fffffffffffffce7,in_stack_fffffffffffffce0),in_stack_fffffffffffffcd8
            );
  boost::unit_test::unit_test_log_t::set_checkpoint
            (in_stack_fffffffffffffd20,(const_string *)file,(size_t)this,msg);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffffcd0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
               ,0x6e);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffcd0);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffd20,(const_string *)file,(size_t)this,msg);
    avro::compileJsonSchemaFromString(local_208);
    ValidSchema::~ValidSchema((ValidSchema *)0x209b4f);
    do {
      pv_ = (undefined1)((ulong)in_stack_fffffffffffffcc8 >> 0x38);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_218,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
                 ,0x6e);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffcd0);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffffd20,(const_string *)file,(size_t)this,msg);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffcd0,(bool)pv_);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffcd8,(char (*) [44])in_stack_fffffffffffffcd0)
      ;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_270,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/SchemaTests.cc"
                 ,0x6e);
      in_stack_fffffffffffffcc8 = (char **)0x0;
      boost::test_tools::tt_detail::report_assertion(&local_240,local_260,&local_270,0x94,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[44],_const_char_(&)[44]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[44],_const_char_(&)[44]>
                          *)0x209c36);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x209c43);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  return;
}

Assistant:

static void testBasic_fail(const char* schema)
{
    BOOST_TEST_CHECKPOINT(schema);
    BOOST_CHECK_THROW(compileJsonSchemaFromString(schema), Exception);
}